

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_writer.c
# Opt level: O1

void rfc5444_writer_unregister_message(rfc5444_writer *writer,rfc5444_writer_message *msg)

{
  if (writer->_state != RFC5444_WRITER_NONE) {
    __assert_fail("writer->_state == RFC5444_WRITER_NONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_writer.c"
                  ,0x1b2,
                  "void rfc5444_writer_unregister_message(struct rfc5444_writer *, struct rfc5444_writer_message *)"
                 );
  }
  if (((msg->_msgcreator_node).list.next != (list_entity *)0x0) &&
     ((msg->_msgcreator_node).list.prev != (list_entity *)0x0)) {
    _rfc5444_writer_free_addresses(writer,msg);
    msg->_registered = false;
    _lazy_free_message(writer,msg);
    return;
  }
  return;
}

Assistant:

void
rfc5444_writer_unregister_message(struct rfc5444_writer *writer, struct rfc5444_writer_message *msg) {
#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_NONE);
#endif

  if (!avl_is_node_added(&msg->_msgcreator_node)) {
    return;
  }

  /* free addresses */
  _rfc5444_writer_free_addresses(writer, msg);

  /* mark message as unregistered */
  msg->_registered = false;
  _lazy_free_message(writer, msg);
}